

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,FileDescriptor *descriptor,
          bool immutable,bool kotlin)

{
  undefined7 in_register_00000009;
  string sStack_48;
  
  FileJavaPackage_abi_cxx11_
            (__return_storage_ptr__,(java *)descriptor,
             (FileDescriptor *)(CONCAT71(in_register_00000009,immutable) & 0xffffffff),immutable);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  GetFileClassName_abi_cxx11_(&sStack_48,this,descriptor,immutable,kotlin);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_48);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetClassName(const FileDescriptor* descriptor,
                                            bool immutable, bool kotlin) {
  std::string result = FileJavaPackage(descriptor, immutable);
  if (!result.empty()) result += '.';
  result += GetFileClassName(descriptor, immutable, kotlin);
  return result;
}